

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamAlignment.cpp
# Opt level: O2

bool __thiscall
BamTools::BamAlignment::SkipToNextTag
          (BamAlignment *this,char storageType,char **pTagData,uint *numBytesParsed)

{
  char cVar1;
  byte __rhs;
  byte *pbVar2;
  char *pcVar3;
  uint uVar4;
  undefined7 in_register_00000031;
  int iVar5;
  uint uVar6;
  string message;
  allocator local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  ulong uVar7;
  
  iVar5 = (int)CONCAT71(in_register_00000031,storageType);
  switch(iVar5) {
  case 0x41:
  case 0x43:
switchD_00189950_caseD_41:
    *numBytesParsed = *numBytesParsed + 1;
    *pTagData = *pTagData + 1;
    return true;
  case 0x42:
    pbVar2 = (byte *)*pTagData;
    __rhs = *pbVar2;
    uVar4 = *numBytesParsed;
    *numBytesParsed = uVar4 + 1;
    *pTagData = (char *)(pbVar2 + 1);
    iVar5 = *(int *)(pbVar2 + 1);
    uVar4 = uVar4 + 5;
    *numBytesParsed = uVar4;
    *pTagData = (char *)(pbVar2 + 5);
    uVar6 = __rhs - 0x43;
    uVar7 = (ulong)uVar6;
    if (uVar6 < 0x31) {
      if ((0x4800000040U >> (uVar7 & 0x3f) & 1) != 0) {
        iVar5 = iVar5 << 2;
LAB_00189a6d:
        *numBytesParsed = uVar4 + iVar5;
        *pTagData = (char *)(pbVar2 + 5 + iVar5);
        return true;
      }
      if ((0x100000001U >> (uVar7 & 0x3f) & 1) != 0) goto LAB_00189a6d;
      if ((0x1000000010000U >> (uVar7 & 0x3f) & 1) != 0) {
        iVar5 = iVar5 * 2;
        goto LAB_00189a6d;
      }
    }
    std::__cxx11::string::string((string *)&local_50,"invalid binary array type: ",&local_51);
    std::operator+(&local_30,&local_50,__rhs);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string((string *)&local_50,"BamAlignment::SkipToNextTag",&local_51);
    SetErrorString(this,&local_50,&local_30);
    goto LAB_001899f0;
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
switchD_00189950_caseD_44:
    std::__cxx11::string::string((string *)&local_50,"invalid tag type: ",&local_51);
    std::operator+(&local_30,&local_50,storageType);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string((string *)&local_50,"BamAlignment::SkipToNextTag",&local_51);
    SetErrorString(this,&local_50,&local_30);
LAB_001899f0:
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
    return false;
  case 0x48:
switchD_00189950_caseD_48:
    uVar4 = *numBytesParsed;
    pcVar3 = *pTagData;
    do {
      uVar4 = uVar4 + 1;
      cVar1 = *pcVar3;
      *numBytesParsed = uVar4;
      *pTagData = pcVar3 + 1;
      pcVar3 = pcVar3 + 1;
    } while (cVar1 != '\0');
    break;
  case 0x49:
switchD_00189950_caseD_49:
    *numBytesParsed = *numBytesParsed + 4;
    *pTagData = *pTagData + 4;
    return true;
  default:
    if (iVar5 != 0x53) {
      if (iVar5 == 0x5a) goto switchD_00189950_caseD_48;
      if (iVar5 != 0x73) {
        if ((iVar5 == 0x66) || (iVar5 == 0x69)) goto switchD_00189950_caseD_49;
        if (iVar5 == 99) goto switchD_00189950_caseD_41;
        goto switchD_00189950_caseD_44;
      }
    }
    *numBytesParsed = *numBytesParsed + 2;
    *pTagData = *pTagData + 2;
  }
  return true;
}

Assistant:

bool BamAlignment::SkipToNextTag(const char storageType, char*& pTagData,
                                 unsigned int& numBytesParsed) const
{
    switch (storageType) {

        case (Constants::BAM_TAG_TYPE_ASCII):
        case (Constants::BAM_TAG_TYPE_INT8):
        case (Constants::BAM_TAG_TYPE_UINT8):
            ++numBytesParsed;
            ++pTagData;
            break;

        case (Constants::BAM_TAG_TYPE_INT16):
        case (Constants::BAM_TAG_TYPE_UINT16):
            numBytesParsed += sizeof(uint16_t);
            pTagData += sizeof(uint16_t);
            break;

        case (Constants::BAM_TAG_TYPE_FLOAT):
        case (Constants::BAM_TAG_TYPE_INT32):
        case (Constants::BAM_TAG_TYPE_UINT32):
            numBytesParsed += sizeof(uint32_t);
            pTagData += sizeof(uint32_t);
            break;

        case (Constants::BAM_TAG_TYPE_STRING):
        case (Constants::BAM_TAG_TYPE_HEX):
            while (*pTagData) {
                ++numBytesParsed;
                ++pTagData;
            }
            // increment for null-terminator
            ++numBytesParsed;
            ++pTagData;
            break;

        case (Constants::BAM_TAG_TYPE_ARRAY):

        {
            // read array type
            const char arrayType = *pTagData;
            ++numBytesParsed;
            ++pTagData;

            // read number of elements
            int32_t numElements;
            memcpy(&numElements, pTagData, sizeof(uint32_t));  // already endian-swapped, if needed
            numBytesParsed += sizeof(uint32_t);
            pTagData += sizeof(uint32_t);

            // calculate number of bytes to skip
            int bytesToSkip = 0;
            switch (arrayType) {
                case (Constants::BAM_TAG_TYPE_INT8):
                case (Constants::BAM_TAG_TYPE_UINT8):
                    bytesToSkip = numElements;
                    break;
                case (Constants::BAM_TAG_TYPE_INT16):
                case (Constants::BAM_TAG_TYPE_UINT16):
                    bytesToSkip = numElements * sizeof(uint16_t);
                    break;
                case (Constants::BAM_TAG_TYPE_FLOAT):
                case (Constants::BAM_TAG_TYPE_INT32):
                case (Constants::BAM_TAG_TYPE_UINT32):
                    bytesToSkip = numElements * sizeof(uint32_t);
                    break;
                default:
                    const std::string message =
                        std::string("invalid binary array type: ") + arrayType;
                    SetErrorString("BamAlignment::SkipToNextTag", message);
                    return false;
            }

            // skip binary array contents
            numBytesParsed += bytesToSkip;
            pTagData += bytesToSkip;
            break;
        }

        default:
            const std::string message = std::string("invalid tag type: ") + storageType;
            SetErrorString("BamAlignment::SkipToNextTag", message);
            return false;
    }

    // if we get here, tag skipped OK - return success
    return true;
}